

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::walkTree<0,(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,MultiIndexSet *work,double *x,
          vector<int,_std::allocator<int>_> *sindx,vector<double,_std::allocator<double>_> *svals,
          double *y)

{
  int iVar1;
  size_t sVar2;
  pointer pdVar3;
  long lVar4;
  pointer piVar5;
  pointer piVar6;
  long lVar7;
  pointer piVar8;
  int *r;
  int *piVar9;
  long lVar10;
  int iVar11;
  double dVar12;
  bool isSupported;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<double,_std::allocator<double>_> basis_derivative;
  bool local_92;
  allocator_type local_91;
  MultiIndexSet *local_90;
  double *local_88;
  vector<int,_std::allocator<int>_> local_80;
  vector<int,_std::allocator<int>_> local_68;
  int *local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_90 = work;
  local_88 = x;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_68,(long)this->top_level + 1,(allocator_type *)&local_80);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_80,(long)this->top_level + 1,(allocator_type *)&local_48);
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_48,(long)(this->super_BaseCanonicalGrid).num_dimensions,&local_91);
  piVar9 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = (this->roots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (piVar9 != local_50) {
    do {
      dVar12 = evalBasisSupported<(TasGrid::RuleLocal::erule)4>
                         (this,(local_90->indexes).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start +
                               (long)*piVar9 * local_90->num_dimensions,local_88,&local_92);
      if (local_92 == true) {
        iVar11 = *piVar9;
        lVar4 = (long)(this->super_BaseCanonicalGrid).num_outputs;
        if (0 < lVar4) {
          sVar2 = (this->surpluses).stride;
          pdVar3 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          lVar10 = 0;
          do {
            y[lVar10] = pdVar3[sVar2 * (long)iVar11 + lVar10] * dVar12 + y[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar4 != lVar10);
        }
        *local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = iVar11;
        piVar6 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar11 = piVar6[*piVar9];
        *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = iVar11;
        if (iVar11 < piVar6[(long)*local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + 1]) {
          iVar11 = 0;
          piVar5 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            if (piVar8[iVar11] < piVar6[(long)piVar5[iVar11] + 1]) {
              iVar1 = (this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[piVar8[iVar11]];
              lVar4 = (long)iVar1;
              dVar12 = evalBasisSupported<(TasGrid::RuleLocal::erule)4>
                                 (this,(local_90->indexes).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                                       local_90->num_dimensions * lVar4,local_88,&local_92);
              piVar5 = local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar8 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (local_92 == true) {
                lVar10 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (0 < lVar10) {
                  sVar2 = (this->surpluses).stride;
                  pdVar3 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar7 = 0;
                  do {
                    y[lVar7] = pdVar3[sVar2 * lVar4 + lVar7] * dVar12 + y[lVar7];
                    lVar7 = lVar7 + 1;
                  } while (lVar10 != lVar7);
                }
                local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)iVar11 + 1] = iVar1;
                piVar6 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)iVar11 + 1] = piVar6[lVar4];
                iVar11 = iVar11 + 1;
              }
              else {
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar11] =
                     local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar11] + 1;
                piVar6 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
            }
            else {
              piVar8[(long)iVar11 + -1] = piVar8[(long)iVar11 + -1] + 1;
              iVar11 = iVar11 + -1;
            }
          } while (*piVar8 < piVar6[(long)*piVar5 + 1]);
        }
      }
      piVar9 = piVar9 + 1;
    } while (piVar9 != local_50);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void walkTree(const MultiIndexSet &work, const double x[], std::vector<int> &sindx, std::vector<double> &svals, double *y) const{
        std::vector<int> monkey_count(top_level+1); // traverse the tree, counts the branches of the current node
        std::vector<int> monkey_tail(top_level+1); // traverse the tree, keeps track of the previous node (history)

        bool isSupported;
        double basis_value;
        std::vector<double> basis_derivative(num_dimensions);

        for(const auto &r : roots){
            if (mode == 3 or mode == 4) {
                diffBasisSupported<effrule>(work.getIndex(r), x, basis_derivative.data(), isSupported);
            } else {
                basis_value = evalBasisSupported<effrule>(work.getIndex(r), x, isSupported);
            }

            if (isSupported){
                if (mode == 0){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        y[k] += basis_value * s[k];
                }else if (mode == 1 or mode == 2){
                    sindx.push_back(r);
                    svals.push_back(basis_value);
                }else if (mode == 3){
                    double const *s = surpluses.getStrip(r);
                    for(int k=0; k<num_outputs; k++)
                        for (int d=0; d<num_dimensions; d++)
                            y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                }else{
                    sindx.push_back(r);
                    for (auto dx : basis_derivative)
                        svals.push_back(dx);
                }

                int current = 0;
                monkey_tail[0] = r;
                monkey_count[0] = pntr[r];

                while(monkey_count[0] < pntr[monkey_tail[0]+1]){
                    if (monkey_count[current] < pntr[monkey_tail[current]+1]){
                        int p = indx[monkey_count[current]];
                        if (mode == 3 or mode == 4){
                            diffBasisSupported<effrule>(work.getIndex(p), x, basis_derivative.data(), isSupported);
                        }else{
                            basis_value = evalBasisSupported<effrule>(work.getIndex(p), x, isSupported);
                        }
                        if (isSupported){
                            if (mode == 0){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    y[k] += basis_value * s[k];
                            }else if (mode == 1 or mode == 2){
                                sindx.push_back(p);
                                svals.push_back(basis_value);
                            }else if (mode == 3){
                                double const *s = surpluses.getStrip(p);
                                for(int k=0; k<num_outputs; k++)
                                    for (int d=0; d<num_dimensions; d++)
                                        y[k * num_dimensions + d] += basis_derivative[d] * s[k];
                            }else{
                                sindx.push_back(p);
                                for (auto dx : basis_derivative)
                                    svals.push_back(dx);
                            }
                            monkey_tail[++current] = p;
                            monkey_count[current] = pntr[p];
                        }else{
                            monkey_count[current]++;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }

        // according to https://docs.nvidia.com/cuda/cusparse/index.html#sparse-format
        // "... it is assumed that the indices are provided in increasing order and that each index appears only once."
        // This may not be a requirement for cusparseDgemvi(), but it may be that I have not tested it sufficiently
        // Also, see AccelerationDataGPUFull::cusparseMatveci() for inaccuracies in Nvidia documentation
        if (mode == 2){
            std::vector<int> map(sindx);
            std::iota(map.begin(), map.end(), 0);
            std::sort(map.begin(), map.end(), [&](int a, int b)->bool{ return (sindx[a] < sindx[b]); });

            std::vector<int> idx = sindx;
            std::vector<double> vls = svals;
            std::transform(map.begin(), map.end(), sindx.begin(), [&](int i)->int{ return idx[i]; });
            std::transform(map.begin(), map.end(), svals.begin(), [&](int i)->double{ return vls[i]; });
        }
    }